

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereLoopAddVirtual(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  int *piVar1;
  byte bVar2;
  SrcList *pSVar3;
  ExprList *pEVar4;
  Expr *pEVar5;
  Bitmask BVar6;
  WhereLoop *pWVar7;
  int iVar8;
  uint uVar9;
  uint extraout_EAX;
  sqlite3_index_info *pIdxInfo;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  u8 uVar15;
  ushort uVar16;
  ulong uVar17;
  ExprList_item *pEVar18;
  WhereTerm *pWVar19;
  ulong uVar20;
  u16 *puVar21;
  WhereClause *pWVar22;
  ushort uVar23;
  Select *pSVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  Parse *pParse;
  ulong uVar29;
  int bIn;
  uint local_84;
  int local_80;
  uint local_7c;
  undefined8 local_78;
  ulong local_70;
  WhereLoopBuilder *local_68;
  Bitmask local_60;
  WhereClause *local_58;
  ulong local_50;
  WhereLoop *local_48;
  ulong local_40;
  Parse *local_38;
  
  local_58 = pBuilder->pWC;
  pSVar3 = pBuilder->pWInfo->pTabList;
  local_48 = pBuilder->pNew;
  bVar2 = local_48->iTab;
  local_78 = pSVar3->a + bVar2;
  pEVar4 = pBuilder->pOrderBy;
  iVar12 = local_58->nTerm;
  iVar8 = 0;
  if (0 < iVar12) {
    puVar21 = &local_58->a->wtFlags;
    iVar8 = 0;
    do {
      if (((*(int *)(puVar21 + 5) == pSVar3->a[bVar2].iCursor) &&
          ((*(ulong *)(puVar21 + 0xf) & mUnusable) == 0)) && ((puVar21[1] & 0xf7ff) != 0)) {
        iVar8 = iVar8 + (uint)((*puVar21 & 0x80) == 0);
      }
      puVar21 = puVar21 + 0x20;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
  }
  pParse = pBuilder->pWInfo->pParse;
  uVar26 = 0;
  if (pEVar4 != (ExprList *)0x0) {
    uVar11 = pEVar4->nExpr;
    uVar13 = 0;
    if (0 < (int)uVar11) {
      pEVar18 = pEVar4->a;
      uVar13 = 0;
      do {
        if ((pEVar18->pExpr->op != 0xa2) || (pEVar18->pExpr->iTable != pSVar3->a[bVar2].iCursor))
        goto LAB_00184ac5;
        uVar13 = uVar13 + 1;
        pEVar18 = pEVar18 + 1;
      } while (uVar11 != uVar13);
      uVar13 = (ulong)uVar11;
    }
LAB_00184ac5:
    uVar26 = 0;
    if ((uint)uVar13 == uVar11) {
      uVar26 = uVar11;
    }
  }
  lVar27 = (long)iVar8;
  local_50 = CONCAT44(local_50._4_4_,uVar26);
  local_68 = pBuilder;
  local_60 = mPrereq;
  pIdxInfo = (sqlite3_index_info *)
             sqlite3DbMallocZero(pParse->db,(long)(int)uVar26 * 8 + lVar27 * 0x14 + 0x70);
  if (pIdxInfo == (sqlite3_index_info *)0x0) {
    pIdxInfo = (sqlite3_index_info *)0x0;
    sqlite3ErrorMsg(pParse,"out of memory");
    local_7c = extraout_EAX;
  }
  else {
    uVar13 = lVar27 * 3;
    pIdxInfo->nConstraint = iVar8;
    pIdxInfo->nOrderBy = uVar26;
    pIdxInfo->aConstraint = (sqlite3_index_constraint *)&pIdxInfo[1].nOrderBy;
    pIdxInfo->aOrderBy = (sqlite3_index_orderby *)(&pIdxInfo[1].nOrderBy + lVar27 * 3);
    pIdxInfo->aConstraintUsage =
         (sqlite3_index_constraint_usage *)
         ((sqlite3_index_orderby *)(&pIdxInfo[1].nOrderBy + lVar27 * 3) + (int)uVar26);
    *(WhereClause **)(pIdxInfo + 1) = local_58;
    pIdxInfo[1].aConstraint = (sqlite3_index_constraint *)pParse;
    uVar26 = local_58->nTerm;
    if ((int)uVar26 < 1) {
      local_7c = 0;
    }
    else {
      pWVar19 = local_58->a;
      iVar12 = local_78->iCursor;
      uVar11 = 0;
      iVar8 = 0;
      local_7c = 0;
      do {
        if ((((pWVar19->leftCursor == iVar12) && ((pWVar19->prereqRight & mUnusable) == 0)) &&
            ((uVar16 = pWVar19->eOperator, (uVar16 & 0xf7ff) != 0 &&
             ((pWVar19->wtFlags & 0x80) == 0)))) &&
           (((((local_78->fg).jointype & 8) == 0 || ((uVar16 & 0x180) == 0)) ||
            ((pWVar19->pExpr->flags & 1) != 0)))) {
          piVar1 = &pIdxInfo[1].nOrderBy + (long)iVar8 * 3;
          *piVar1 = (pWVar19->u).leftColumn;
          piVar1[2] = uVar11;
          uVar16 = uVar16 & 0x1fff;
          uVar23 = uVar16;
          if (uVar16 == 1) {
            uVar23 = 2;
          }
          if (uVar23 == 0x40) {
            uVar15 = pWVar19->eMatchOp;
LAB_00184c0d:
            *(u8 *)(piVar1 + 1) = uVar15;
          }
          else {
            if ((uVar23 & 0x180) != 0) {
              uVar15 = 'H' - (uVar23 == 0x100);
              goto LAB_00184c0d;
            }
            *(char *)(piVar1 + 1) = (char)uVar23;
            if ((uVar23 & 0x3c) != 0) {
              pEVar5 = pWVar19->pExpr->pRight;
              uVar15 = pEVar5->op;
              if (uVar15 == 0xa8) {
                uVar15 = pEVar5->op2;
              }
              if (uVar15 == 0x83) {
                pSVar24 = (pEVar5->x).pSelect;
              }
              else {
                if (uVar15 != 0xa9) goto LAB_00184c12;
                pSVar24 = (Select *)&pEVar5->x;
              }
              if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar24->pEList)->pList->nExpr) {
                uVar9 = 1 << ((byte)uVar11 & 0x1f);
                if (0xf < uVar11) {
                  uVar9 = 0;
                }
                local_7c = local_7c | uVar9;
                local_70 = uVar13;
                if (uVar16 == 0x10) {
                  uVar15 = '\b';
                }
                else {
                  if (uVar16 != 4) goto LAB_00184c12;
                  uVar15 = ' ';
                }
                goto LAB_00184c0d;
              }
            }
          }
LAB_00184c12:
          iVar8 = iVar8 + 1;
        }
        uVar11 = uVar11 + 1;
        pWVar19 = pWVar19 + 1;
      } while (uVar26 != uVar11);
    }
    if (0 < (int)local_50) {
      lVar14 = 0;
      do {
        *(int *)((long)&pIdxInfo[1].nOrderBy + lVar14 + lVar27 * 0xc) =
             (int)*(short *)(*(long *)((long)&pEVar4->a[0].pExpr + lVar14 * 4) + 0x30);
        (&pIdxInfo[1].field_0x14)[lVar14 + lVar27 * 0xc] = (&pEVar4->a[0].sortOrder)[lVar14 * 4];
        lVar14 = lVar14 + 8;
      } while ((local_50 & 0xffffffff) << 3 != lVar14);
    }
  }
  pWVar7 = local_48;
  if (pIdxInfo == (sqlite3_index_info *)0x0) {
    iVar12 = 7;
  }
  else {
    local_48->rSetup = 0;
    local_48->wsFlags = 0x400;
    local_48->nLTerm = 0;
    (local_48->u).vtab.needFree = '\0';
    uVar13 = (ulong)(uint)pIdxInfo->nConstraint;
    iVar8 = whereLoopResize(pParse->db,local_48,pIdxInfo->nConstraint);
    BVar6 = local_60;
    iVar12 = 7;
    if (iVar8 == 0) {
      local_78 = (SrcList_item *)(CONCAT44(local_78._4_4_,local_7c) & 0xffffffff0000ffff);
      iVar12 = whereLoopAddVirtualOne
                         (local_68,local_60,0xffffffffffffffff,0,pIdxInfo,(u16)local_7c,&local_80);
      if (iVar12 == 0) {
        uVar29 = ~BVar6;
        uVar25 = pWVar7->prereq & uVar29;
        iVar12 = 0;
        if (local_80 != 0 || uVar25 != 0) {
          local_38 = pParse;
          if (local_80 == 0) {
            iVar12 = 0;
            uVar26 = 0;
            local_50 = 0;
          }
          else {
            iVar12 = whereLoopAddVirtualOne
                               (local_68,local_60,0xffffffffffffffff,1,pIdxInfo,(u16)local_78,
                                &local_80);
            local_50 = pWVar7->prereq & uVar29;
            uVar26 = (uint)(local_50 == 0);
          }
          lVar27 = uVar13 * 0xc;
          pWVar22 = local_58;
          uVar28 = 0;
          local_84 = uVar26;
          local_70 = uVar13;
          local_40 = uVar25;
          do {
            BVar6 = local_60;
            if (iVar12 != 0) break;
            if ((int)uVar13 < 1) {
              uVar10 = 0xffffffffffffffff;
            }
            else {
              uVar10 = 0xffffffffffffffff;
              lVar14 = 0;
              do {
                uVar17 = pWVar22->a[*(int *)((long)&pIdxInfo->aConstraint->iTermOffset + lVar14)].
                         prereqRight & uVar29;
                uVar20 = uVar10;
                if (uVar17 < uVar10) {
                  uVar20 = uVar17;
                }
                if (uVar28 < uVar17) {
                  uVar10 = uVar20;
                }
                lVar14 = lVar14 + 0xc;
              } while (lVar27 != lVar14);
            }
            iVar12 = 0;
            if (((uVar10 != 0xffffffffffffffff) && (uVar10 != uVar25)) &&
               ((iVar12 = 0, uVar10 != local_50 &&
                ((local_7c = uVar26,
                 iVar12 = whereLoopAddVirtualOne
                                    (local_68,local_60,uVar10 | local_60,0,pIdxInfo,(u16)local_78,
                                     &local_80), uVar13 = local_70, pWVar22 = local_58,
                 uVar25 = local_40, uVar26 = local_7c, local_48->prereq == BVar6 &&
                 (uVar26 = 1, local_80 == 0)))))) {
              local_84 = 1;
            }
            uVar28 = uVar10;
          } while (uVar10 != 0xffffffffffffffff);
          pParse = local_38;
          if (uVar26 == 0 && iVar12 == 0) {
            iVar12 = whereLoopAddVirtualOne
                               (local_68,local_60,local_60,0,pIdxInfo,(u16)local_78,&local_80);
            if (local_80 == 0) {
              local_84 = 1;
            }
          }
          if (local_84 == 0 && iVar12 == 0) {
            iVar12 = whereLoopAddVirtualOne
                               (local_68,local_60,local_60,1,pIdxInfo,(u16)local_78,&local_80);
          }
        }
      }
      if (pIdxInfo->needToFreeIdxStr != 0) {
        sqlite3_free(pIdxInfo->idxStr);
      }
    }
    sqlite3DbFreeNN(pParse->db,pIdxInfo);
  }
  return iVar12;
}

Assistant:

static int whereLoopAddVirtual(
  WhereLoopBuilder *pBuilder,  /* WHERE clause information */
  Bitmask mPrereq,             /* Tables that must be scanned before this one */
  Bitmask mUnusable            /* Tables that must be scanned after this one */
){
  int rc = SQLITE_OK;          /* Return code */
  WhereInfo *pWInfo;           /* WHERE analysis context */
  Parse *pParse;               /* The parsing context */
  WhereClause *pWC;            /* The WHERE clause */
  struct SrcList_item *pSrc;   /* The FROM clause term to search */
  sqlite3_index_info *p;       /* Object to pass to xBestIndex() */
  int nConstraint;             /* Number of constraints in p */
  int bIn;                     /* True if plan uses IN(...) operator */
  WhereLoop *pNew;
  Bitmask mBest;               /* Tables used by best possible plan */
  u16 mNoOmit;

  assert( (mPrereq & mUnusable)==0 );
  pWInfo = pBuilder->pWInfo;
  pParse = pWInfo->pParse;
  pWC = pBuilder->pWC;
  pNew = pBuilder->pNew;
  pSrc = &pWInfo->pTabList->a[pNew->iTab];
  assert( IsVirtual(pSrc->pTab) );
  p = allocateIndexInfo(pParse, pWC, mUnusable, pSrc, pBuilder->pOrderBy, 
      &mNoOmit);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  pNew->rSetup = 0;
  pNew->wsFlags = WHERE_VIRTUALTABLE;
  pNew->nLTerm = 0;
  pNew->u.vtab.needFree = 0;
  nConstraint = p->nConstraint;
  if( whereLoopResize(pParse->db, pNew, nConstraint) ){
    sqlite3DbFree(pParse->db, p);
    return SQLITE_NOMEM_BKPT;
  }

  /* First call xBestIndex() with all constraints usable. */
  WHERETRACE(0x800, ("BEGIN %s.addVirtual()\n", pSrc->pTab->zName));
  WHERETRACE(0x40, ("  VirtualOne: all usable\n"));
  rc = whereLoopAddVirtualOne(pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn);

  /* If the call to xBestIndex() with all terms enabled produced a plan
  ** that does not require any source tables (IOW: a plan with mBest==0)
  ** and does not use an IN(...) operator, then there is no point in making 
  ** any further calls to xBestIndex() since they will all return the same
  ** result (if the xBestIndex() implementation is sane). */
  if( rc==SQLITE_OK && ((mBest = (pNew->prereq & ~mPrereq))!=0 || bIn) ){
    int seenZero = 0;             /* True if a plan with no prereqs seen */
    int seenZeroNoIN = 0;         /* Plan with no prereqs and no IN(...) seen */
    Bitmask mPrev = 0;
    Bitmask mBestNoIn = 0;

    /* If the plan produced by the earlier call uses an IN(...) term, call
    ** xBestIndex again, this time with IN(...) terms disabled. */
    if( bIn ){
      WHERETRACE(0x40, ("  VirtualOne: all usable w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, ALLBITS, WO_IN, p, mNoOmit, &bIn);
      assert( bIn==0 );
      mBestNoIn = pNew->prereq & ~mPrereq;
      if( mBestNoIn==0 ){
        seenZero = 1;
        seenZeroNoIN = 1;
      }
    }

    /* Call xBestIndex once for each distinct value of (prereqRight & ~mPrereq) 
    ** in the set of terms that apply to the current virtual table.  */
    while( rc==SQLITE_OK ){
      int i;
      Bitmask mNext = ALLBITS;
      assert( mNext>0 );
      for(i=0; i<nConstraint; i++){
        Bitmask mThis = (
            pWC->a[p->aConstraint[i].iTermOffset].prereqRight & ~mPrereq
        );
        if( mThis>mPrev && mThis<mNext ) mNext = mThis;
      }
      mPrev = mNext;
      if( mNext==ALLBITS ) break;
      if( mNext==mBest || mNext==mBestNoIn ) continue;
      WHERETRACE(0x40, ("  VirtualOne: mPrev=%04llx mNext=%04llx\n",
                       (sqlite3_uint64)mPrev, (sqlite3_uint64)mNext));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mNext|mPrereq, 0, p, mNoOmit, &bIn);
      if( pNew->prereq==mPrereq ){
        seenZero = 1;
        if( bIn==0 ) seenZeroNoIN = 1;
      }
    }

    /* If the calls to xBestIndex() in the above loop did not find a plan
    ** that requires no source tables at all (i.e. one guaranteed to be
    ** usable), make a call here with all source tables disabled */
    if( rc==SQLITE_OK && seenZero==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, 0, p, mNoOmit, &bIn);
      if( bIn==0 ) seenZeroNoIN = 1;
    }

    /* If the calls to xBestIndex() have so far failed to find a plan
    ** that requires no source tables at all and does not use an IN(...)
    ** operator, make a final call to obtain one here.  */
    if( rc==SQLITE_OK && seenZeroNoIN==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled and w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, WO_IN, p, mNoOmit, &bIn);
    }
  }

  if( p->needToFreeIdxStr ) sqlite3_free(p->idxStr);
  sqlite3DbFreeNN(pParse->db, p);
  WHERETRACE(0x800, ("END %s.addVirtual(), rc=%d\n", pSrc->pTab->zName, rc));
  return rc;
}